

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcircuit.cpp
# Opt level: O2

bool __thiscall
SubCircuit<4>::exploreSubtree
          (SubCircuit<4> *this,int thisNode,int startPrevSubtree,int endPrevSubtree,int *backfrom,
          int *backto,int *numback)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  bool bVar5;
  Lit LVar6;
  Lit LVar7;
  Clause *pCVar8;
  Lit *pLVar9;
  int iVar10;
  vec<int> *this_00;
  uint i_3;
  long lVar11;
  uint i_1;
  ulong uVar12;
  long v;
  uint i_4;
  int thisNode_00;
  long lVar13;
  vec<int> local_1b8;
  int local_1a0;
  int local_19c;
  vec<int> local_198;
  Clause *local_180;
  int local_178;
  int local_174;
  vec<int> *local_170;
  vec<int> *local_168;
  int local_160;
  int thisNode_local;
  iterator i;
  vec<int> local_118 [4];
  vec<int> local_d8;
  vec<int> local_c8;
  vec<int> local_b8;
  vec<int> local_a8;
  vec<int> local_98;
  vec<int> local_88;
  vec<int> *local_78;
  vec<int> local_70;
  vec<int> local_60;
  vec<int> local_50;
  vec<int> local_40;
  
  iVar10 = this->nodesSeen;
  this->nodesSeen = iVar10 + 1;
  v = (long)thisNode;
  this->index[v] = iVar10;
  this->lowlink[v] = iVar10;
  i.view = this->x + v;
  i.forward.var = this->x[v].var;
  i.forward.val = ((i.forward.var)->min).v;
  local_170 = &this->prev;
  local_168 = &this->later;
  local_78 = &this->earlier;
  iVar10 = 1;
  local_19c = startPrevSubtree;
  local_178 = endPrevSubtree;
  thisNode_local = thisNode;
  do {
    lVar13 = (long)i.forward.val + (long)(i.view)->b;
    piVar4 = this->index;
    iVar1 = piVar4[lVar13];
    thisNode_00 = (int)lVar13;
    if (iVar1 == -1) {
      bVar5 = exploreSubtree(this,thisNode_00,local_19c,local_178,backfrom,backto,numback);
      if (!bVar5) {
        return false;
      }
      piVar4 = this->lowlink;
      if (piVar4[lVar13] < piVar4[v]) {
        piVar4[v] = piVar4[lVar13];
      }
      if (((byte)iVar10 & this->pruneWithin) == 1) {
        iVar10 = 0;
        if (piVar4[lVar13] != this->index[v]) goto LAB_0013aa02;
        local_1b8.sz = 0;
        local_1b8.cap = 0;
        local_1b8.data = (int *)0x0;
        local_198.sz = 0;
        local_198.cap = 0;
        local_198.data = (int *)0x0;
        for (local_174 = iVar10; local_174 < *(int *)&(this->super_Propagator).field_0x14;
            local_174 = local_174 + 1) {
          piVar4 = this->index;
          this_00 = &local_1b8;
          if ((piVar4[lVar13] <= piVar4[local_174]) ||
             (this_00 = &local_198, piVar4[local_174] != piVar4[v])) {
            vec<int>::push(this_00,&local_174);
          }
        }
        vec<int>::vec<int>(&local_88,&local_1b8);
        LVar6 = getEvidenceLit(this,&local_88);
        free(local_88.data);
        local_88.data = (int *)0x0;
        vec<int>::vec<int>(&local_98,&local_198);
        LVar7 = getEvidenceLit(this,&local_98);
        free(local_98.data);
        local_98.data = (int *)0x0;
        if (LVar7.x != 1) {
          if (so.lazy == true) {
            local_1a0 = LVar6.x;
            local_180 = Reason_new(local_198.sz * local_1b8.sz + 2);
            pLVar9 = Clause::operator[](local_180,1);
            pLVar9->x = LVar7.x;
            vec<int>::vec<int>(local_118,&local_1b8);
            vec<int>::vec<int>(&local_a8,&local_198);
            pCVar8 = local_180;
            explainAcantreachB(this,local_180,2,local_118,&local_a8,-1,-1);
            free(local_a8.data);
            local_a8.data = (int *)0x0;
            free(local_118[0].data);
            local_118[0].data = (int *)0x0;
            LVar6.x = local_1a0;
          }
          else {
            pCVar8 = (Clause *)0x0;
          }
          addPropagation(this,false,thisNode,thisNode_00,pCVar8);
        }
        if (LVar6.x != 1) {
          if (so.lazy == true) {
            pCVar8 = Reason_new(local_198.sz * local_1b8.sz + 2);
            pLVar9 = Clause::operator[](pCVar8,1);
            pLVar9->x = LVar6.x;
            vec<int>::vec<int>(&local_b8,&local_1b8);
            vec<int>::vec<int>(&local_c8,&local_198);
            explainAcantreachB(this,pCVar8,2,&local_b8,&local_c8,-1,-1);
            free(local_c8.data);
            local_c8.data = (int *)0x0;
            free(local_b8.data);
            local_b8.data = (int *)0x0;
          }
          else {
            pCVar8 = (Clause *)0x0;
          }
          for (uVar12 = 0; uVar12 < (local_198._0_8_ & 0xffffffff); uVar12 = uVar12 + 1) {
            bVar5 = IntView<4>::indomain(this->x + local_198.data[uVar12],v);
            if (bVar5) {
              addPropagation(this,false,local_198.data[uVar12],thisNode,pCVar8);
            }
          }
        }
        free(local_198.data);
        free(local_1b8.data);
      }
      iVar10 = 0;
    }
    else if (thisNode_00 != thisNode) {
      if (iVar1 <= local_178 && local_19c <= iVar1) {
        *numback = *numback + 1;
        *backfrom = thisNode;
        *backto = thisNode_00;
      }
      if ((this->pruneSkip == true) && (piVar4[lVar13] < local_19c)) {
        vec<int>::vec<int>(&local_40,local_170);
        LVar6 = getEvidenceLit(this,&local_40);
        free(local_40.data);
        local_40.data = (int *)0x0;
        if (LVar6.x != 1) {
          if (so.lazy == true) {
            local_1b8.sz = 0;
            local_1b8.cap = 0;
            local_1b8.data = (int *)0x0;
            local_1a0 = LVar6.x;
            local_160 = thisNode;
            vec<int>::reserve(&local_1b8,local_168->sz + local_170->sz);
            lVar11 = 0;
            for (uVar12 = 0; uVar12 < local_170->sz; uVar12 = uVar12 + 1) {
              vec<int>::push(&local_1b8,(int *)((long)(this->prev).data + lVar11));
              lVar11 = lVar11 + 4;
            }
            lVar11 = 0;
            for (uVar12 = 0; uVar12 < local_168->sz; uVar12 = uVar12 + 1) {
              vec<int>::push(&local_1b8,(int *)((long)(this->later).data + lVar11));
              lVar11 = lVar11 + 4;
            }
            local_180 = Reason_new(local_1b8.sz * (this->earlier).sz +
                                   local_168->sz * (this->prev).sz + 2);
            pLVar9 = Clause::operator[](local_180,1);
            pLVar9->x = local_1a0;
            vec<int>::vec<int>(&local_50,local_170);
            vec<int>::vec<int>(&local_60,local_168);
            explainAcantreachB(this,local_180,2,&local_50,&local_60,-1,-1);
            free(local_60.data);
            local_60.data = (int *)0x0;
            free(local_50.data);
            local_50.data = (int *)0x0;
            uVar2 = (this->later).sz;
            uVar3 = (this->prev).sz;
            vec<int>::vec<int>(&local_d8,local_78);
            vec<int>::vec<int>(&local_70,&local_1b8);
            explainAcantreachB(this,local_180,uVar2 * uVar3 + 2,&local_d8,&local_70,-1,-1);
            thisNode = local_160;
            free(local_70.data);
            local_70.data = (int *)0x0;
            free(local_d8.data);
            local_d8.data = (int *)0x0;
            free(local_1b8.data);
            pCVar8 = local_180;
          }
          else {
            pCVar8 = (Clause *)0x0;
          }
          addPropagation(this,false,thisNode,thisNode_00,pCVar8);
        }
      }
      if (this->index[lVar13] < this->lowlink[v]) {
        this->lowlink[v] = this->index[lVar13];
      }
    }
LAB_0013aa02:
    IntVar::iterator::operator++(&i.forward);
  } while( true );
}

Assistant:

bool exploreSubtree(int thisNode, int startPrevSubtree, int endPrevSubtree, int* backfrom,
											int* backto, int* numback) {
		// fprintf(stderr,"exploring subtree\n");
		index[thisNode] = nodesSeen++;
		lowlink[thisNode] = index[thisNode];
		bool isFirstChild = true;
		int child;
		for (typename IntView<U>::iterator i = x[thisNode].begin(); i != x[thisNode].end(); ++i) {
			child = *i;
			// If we haven't visited the child yet, do so now
			if (index[child] == -1) {
				// fprintf(stderr,"new child %d\n", child);
				if (!exploreSubtree(child, startPrevSubtree, endPrevSubtree, backfrom, backto, numback)) {
					return false;  // fail if there was an scc contained within this child
				}

				if (lowlink[child] < lowlink[thisNode]) {
					lowlink[thisNode] = lowlink[child];
				}

				// If this is the first child and its lowlink is equal to the
				// parent's index, we can prune the edge from this node to the
				// child (as the circuit must come back up through an edge from
				// the child to this node and therefore can't go in the other
				// direction). We can do this as long as there is a node outside
				// the child and this node which has to be in.
				// We can also prune any edges from a node outside the child's
				// subtree to this node, as long as something inside the child has to be in.
				if (pruneWithin && isFirstChild && lowlink[child] == index[thisNode]) {
					// XXX [AS] Commented following line, because propagator related statistics
					// should be collected within the propagator class.
					// engine.prunedGeneralise++;
					// The reason is that no node in the child's subtree reaches a node outside the subtree
					// that isn't the parent, and at least one node in the child's subtree is in the circuit
					// First divide the nodes into those inside and outside the child's subtree
					vec<int> inside;
					vec<int> outside;
					for (int i = 0; i < size; i++) {
						if (index[i] >= index[child]) {
							inside.push(i);
						} else if (index[i] != index[thisNode]) {
							outside.push(i);
						}
					}

					// Now check one node is definitely in
					const Lit evidenceIn = getEvidenceLit(inside);
					const Lit evidenceOut = getEvidenceLit(outside);
					if (evidenceOut != lit_True) {
						Clause* r = nullptr;
						if (so.lazy) {
							r = Reason_new(inside.size() * outside.size() + 2);
							(*r)[1] = evidenceOut;
							explainAcantreachB(r, 2, inside, outside);
						}
						addPropagation(false, thisNode, child, r);
					}
					if (evidenceIn != lit_True) {
						Clause* r = nullptr;
						if (so.lazy) {
							r = Reason_new(inside.size() * outside.size() + 2);
							(*r)[1] = evidenceIn;
							explainAcantreachB(r, 2, inside, outside);
						}
						for (unsigned int i = 0; i < outside.size(); i++) {
							if (x[outside[i]].indomain(thisNode)) {
								addPropagation(false, outside[i], thisNode, r);
							}
						}
					}
				}

				isFirstChild = false;        // We've now visited at least one child
			} else if (child != thisNode)  // This is a node we've seen before (ignore self-cycle edges)
			{
				// fprintf(stderr,"old child %d\n", child);
				//  If child is within the last subtree we've found a backedge (from this node to the child)
				if (index[child] >= startPrevSubtree && index[child] <= endPrevSubtree) {
					(*numback)++;
					*backfrom = thisNode;
					*backto = child;
				}

				// If w is from a subtree before the previous one prune this edge (if that option is set)
				if (pruneSkip && index[child] < startPrevSubtree) {
					const Lit evidence = getEvidenceLit(prev);
					if (evidence != lit_True) {
						// XXX [AS] Commented following line, because propagator related statistics
						// should be collected within the propagator class.
						// engine.prunedSkip++;
						Clause* r = nullptr;
						if (so.lazy) {
							// The reason is that no node in an earlier
							// subtree can reach the prev or later subtrees,
							// and no node in the prev subtree can reach
							// later subtrees.
							vec<int> prevAndLater;
							prevAndLater.reserve(prev.size() + later.size());
							for (unsigned int i = 0; i < prev.size(); i++) {
								prevAndLater.push(prev[i]);
							}
							for (unsigned int i = 0; i < later.size(); i++) {
								prevAndLater.push(later[i]);
							}
							r = Reason_new(earlier.size() * prevAndLater.size() + prev.size() * later.size() + 2);
							(*r)[1] = evidence;
							explainAcantreachB(r, 2, prev, later);
							explainAcantreachB(r, prev.size() * later.size() + 2, earlier, prevAndLater);
						}
						addPropagation(false, thisNode, child, r);
					}
				}

				if (index[child] < lowlink[thisNode]) {
					lowlink[thisNode] = index[child];
				}
			}
			// fprintf(stderr,"lowpoint is %d\n", lowlink[thisNode]);
		}

		// Fail if there's an scc rooted here
		if (lowlink[thisNode] == index[thisNode]) {
			// The reason is that no node in the subtree rooted by this
			// one (including this one)
			// reaches a node outside that subtree, and some node inside
			// the subtree (not including this node) is required in the circuit.
			// Start by finding the nodes inside and outside the subtree.
			vec<int> inside;
			vec<int> outside;

			for (int i = 0; i < size; i++) {
				if (index[i] > index[thisNode]) {
					inside.push(i);
				} else if (i != thisNode) {
					outside.push(i);
				}
			}

			const Lit evidenceInside = getEvidenceLit(inside);  // at this point inside excludes this node

			inside.push(thisNode);  // now include this node

			// Set all vars outside the component to be self-cycles
			if (evidenceInside != lit_True) {
				Clause* r = nullptr;
				if (so.lazy) {
					r = Reason_new(inside.size() * outside.size() + 2);
					(*r)[1] = evidenceInside;

					explainAcantreachB(r, 2, inside, outside);
				}
				for (unsigned int i = 0; i < outside.size(); i++) {
					const int varOutside = outside[i];
					if (x[varOutside].setValNotR(varOutside)) {
						// XXX [AS] Commented following line, because propagator related statistics
						// should be collected within the propagator class.
						// engine.multipleSCC++;
						addPropagation(true, varOutside, varOutside, r);
						/* if(!x[varOutside].setVal(varOutside, r))
						 {
						 fprintf(stderr, "failing\n");
								 return false;
						 }*/
					}
				}
			}
		}

		return true;
	}